

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMateGeneric::IntStateGatherReactions
          (ChLinkMateGeneric *this,uint off_L,ChVectorDynamic<> *L)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  iVar4 = (*(this->super_ChLinkMate).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
            _vptr_ChObj[9])();
  if ((char)iVar4 != '\0') {
    uVar5 = 0;
    if (this->c_x == true) {
      if ((this->mask).nconstr < 1) goto LAB_005b2e6f;
      uVar5 = 1;
      if (((*(this->mask).constraints.
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).super_ChConstraint.
          active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)off_L) goto LAB_005b2e8e;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (this->super_ChLinkMate).super_ChLink.react_force.m_data[0];
        auVar6._8_8_ = 0x8000000000000000;
        auVar6._0_8_ = 0x8000000000000000;
        auVar6 = vxorpd_avx512vl(auVar7,auVar6);
        dVar1 = (double)vmovlpd_avx(auVar6);
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[off_L]
             = dVar1;
      }
    }
    if (this->c_y == true) {
      if ((this->mask).nconstr <= (int)uVar5) goto LAB_005b2e6f;
      if (((this->mask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)(uVar5 + off_L)) goto LAB_005b2e8e;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (this->super_ChLinkMate).super_ChLink.react_force.m_data[1];
        auVar2._8_8_ = 0x8000000000000000;
        auVar2._0_8_ = 0x8000000000000000;
        auVar6 = vxorpd_avx512vl(auVar8,auVar2);
        dVar1 = (double)vmovlpd_avx(auVar6);
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar5 + off_L] = dVar1;
      }
      uVar5 = uVar5 + 1;
    }
    if (this->c_z == true) {
      if ((this->mask).nconstr <= (int)uVar5) goto LAB_005b2e6f;
      if (((this->mask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)(uVar5 + off_L)) goto LAB_005b2e8e;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (this->super_ChLinkMate).super_ChLink.react_force.m_data[2];
        auVar3._8_8_ = 0x8000000000000000;
        auVar3._0_8_ = 0x8000000000000000;
        auVar6 = vxorpd_avx512vl(auVar9,auVar3);
        dVar1 = (double)vmovlpd_avx(auVar6);
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar5 + off_L] = dVar1;
      }
      uVar5 = uVar5 + 1;
    }
    if (this->c_rx == true) {
      if ((this->mask).nconstr <= (int)uVar5) goto LAB_005b2e6f;
      if (((this->mask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)(uVar5 + off_L)) goto LAB_005b2e8e;
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar5 + off_L] = (this->super_ChLinkMate).super_ChLink.react_torque.m_data[0] * -2.0;
      }
      uVar5 = uVar5 + 1;
    }
    if (this->c_ry == true) {
      if ((this->mask).nconstr <= (int)uVar5) goto LAB_005b2e6f;
      if (((this->mask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)(uVar5 + off_L)) goto LAB_005b2e8e;
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar5 + off_L] = (this->super_ChLinkMate).super_ChLink.react_torque.m_data[1] * -2.0;
      }
      uVar5 = uVar5 + 1;
    }
    if (this->c_rz == true) {
      if ((this->mask).nconstr <= (int)uVar5) {
LAB_005b2e6f:
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      if (((this->mask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)(uVar5 + off_L)) {
LAB_005b2e8e:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar5 + off_L] = (this->super_ChLinkMate).super_ChLink.react_torque.m_data[2] * -2.0;
      }
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntStateGatherReactions(const unsigned int off_L, ChVectorDynamic<>& L) {
    if (!this->IsActive())
        return;

    int nc = 0;
    if (c_x) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -react_force.x();
        nc++;
    }
    if (c_y) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -react_force.y();
        nc++;
    }
    if (c_z) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -react_force.z();
        nc++;
    }
    if (c_rx) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -2.0 * react_torque.x();
        nc++;
    }
    if (c_ry) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -2.0 * react_torque.y();
        nc++;
    }
    if (c_rz) {
        if (mask.Constr_N(nc).IsActive())
            L(off_L + nc) = -2.0 * react_torque.z();
        nc++;
    }
}